

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98player.cpp
# Opt level: O2

void S98Player::SndEmuLogCB(void *userParam,void *source,UINT8 level,char *message)

{
  long lVar1;
  DEVLOG_CB_DATA *cbData;
  
  lVar1 = *userParam;
  if ((*(code **)(lVar1 + 0x30) != (code *)0x0) &&
     ((level < 2 || ((*(byte *)(lVar1 + 0x1ea8) & 8) == 0)))) {
    (**(code **)(lVar1 + 0x30))
              (*(undefined8 *)(lVar1 + 0x38),lVar1,level,1,
               *(undefined8 *)(*(long *)(lVar1 + 0x1dd8) + *(long *)((long)userParam + 8) * 0x20),
               message);
    return;
  }
  return;
}

Assistant:

void S98Player::SndEmuLogCB(void* userParam, void* source, UINT8 level, const char* message)
{
	DEVLOG_CB_DATA* cbData = (DEVLOG_CB_DATA*)userParam;
	S98Player* player = cbData->player;
	if (player->_logCbFunc == NULL)
		return;
	if ((player->_playState & PLAYSTATE_SEEK) && level > PLRLOG_ERROR)
		return;	// prevent message spam while seeking
	player->_logCbFunc(player->_logCbParam, player, level, PLRLOGSRC_EMU,
		player->_devNames[cbData->chipDevID].c_str(), message);
	return;
}